

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterutils.cpp
# Opt level: O1

void __thiscall
YAML::Utils::anon_unknown_0::WriteDoubleQuoteEscapeSequence
          (anon_unknown_0 *this,ostream_wrapper *out,int codePoint,value stringEscapingStyle)

{
  uint uVar1;
  ulong uVar2;
  undefined8 in_RAX;
  undefined4 in_register_0000000c;
  char *__n;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  undefined8 uStack_38;
  
  __n = (char *)CONCAT44(in_register_0000000c,stringEscapingStyle);
  uVar4 = (ulong)out & 0xffffffff;
  uStack_38 = in_RAX;
  while( true ) {
    ostream_wrapper::write((ostream_wrapper *)this,0x76c072,(void *)0x1,(size_t)__n);
    uVar3 = (uint)uVar4;
    __n = (char *)CONCAT71((int7)((ulong)__n >> 8),codePoint != 2);
    if ((int)uVar3 < 0xff && codePoint != 2) break;
    iVar5 = 0x75c16c;
    __n = "u";
    if ((int)uVar3 < 0xffff) {
      iVar5 = 0x76b1bd;
    }
    iVar6 = (uint)(0xfffe < (int)uVar3) * 4 + 4;
    if (((int)uVar3 < 0xffff) || (codePoint != 2)) goto LAB_00717f0b;
    uVar2 = uVar4 >> 10;
    uVar4 = (ulong)(uVar3 & 0x3ff | 0xdc00);
    codePoint = 2;
    WriteDoubleQuoteEscapeSequence
              (this,(ostream_wrapper *)(ulong)((uint)uVar2 & 0xffff | 0xd7c0),2,0x76b1bd);
  }
  iVar6 = 2;
  iVar5 = 0x763b80;
LAB_00717f0b:
  ostream_wrapper::write((ostream_wrapper *)this,iVar5,(void *)0x1,(size_t)__n);
  iVar5 = iVar6 + 1;
  uVar1 = iVar6 * 4;
  do {
    uVar1 = uVar1 - 4;
    uStack_38 = CONCAT17("0123456789abcdef"[(int)uVar3 >> ((byte)uVar1 & 0x1f) & 0xf],
                         (undefined7)uStack_38);
    ostream_wrapper::write((ostream_wrapper *)this,(int)&uStack_38 + 7,(void *)0x1,(ulong)uVar1);
    iVar5 = iVar5 + -1;
  } while (1 < iVar5);
  return;
}

Assistant:

void WriteDoubleQuoteEscapeSequence(ostream_wrapper& out, int codePoint, StringEscaping::value stringEscapingStyle) {
  static const char hexDigits[] = "0123456789abcdef";

  out << "\\";
  int digits = 8;
  if (codePoint < 0xFF && stringEscapingStyle != StringEscaping::JSON) {
    out << "x";
    digits = 2;
  } else if (codePoint < 0xFFFF) {
    out << "u";
    digits = 4;
  } else if (stringEscapingStyle != StringEscaping::JSON) {
    out << "U";
    digits = 8;
  } else {
    auto surrogatePair = EncodeUTF16SurrogatePair(codePoint);
    WriteDoubleQuoteEscapeSequence(out, surrogatePair.first, stringEscapingStyle);
    WriteDoubleQuoteEscapeSequence(out, surrogatePair.second, stringEscapingStyle);
    return;
  }

  // Write digits into the escape sequence
  for (; digits > 0; --digits)
    out << hexDigits[(codePoint >> (4 * (digits - 1))) & 0xF];
}